

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O2

void ddb_h1(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  double dVar1;
  Integer IVar2;
  Integer IVar3;
  bool bVar4;
  long lVar5;
  double *ardims_00;
  long lVar6;
  double *qedims;
  long *pdivs;
  Integer *pedims_00;
  long lVar7;
  long lVar8;
  size_t __nmemb;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (ndims == 1) {
    *pedims = npes;
    ndims = 1;
    dd_ev(1,ardims,pedims);
LAB_0018f9e9:
    dd_su(ndims,ardims,pedims,blk);
    return;
  }
  ardims_00 = (double *)calloc(ndims,8);
  if (ardims_00 == (double *)0x0) {
    lVar9 = 0;
    fprintf(_stderr,"%s: %s\n","ddb_h1","memory allocation failed");
    if (ndims < 1) {
      ndims = lVar9;
    }
    for (; ndims != lVar9; lVar9 = lVar9 + 1) {
      blk[lVar9] = 0;
    }
    return;
  }
  lVar6 = 0;
  lVar9 = 0;
  if (0 < ndims) {
    lVar9 = ndims;
  }
  for (; lVar9 != lVar6; lVar6 = lVar6 + 1) {
    if (blk[lVar6] < 1) {
      blk[lVar6] = 1;
    }
  }
  for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
    ardims_00[lVar6] = (double)(ardims[lVar6] / blk[lVar6]);
  }
  for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
    if ((long)ardims_00[lVar6] < 1) {
      ardims_00[lVar6] = 4.94065645841247e-324;
      blk[lVar6] = ardims[lVar6];
    }
  }
  qedims = (double *)calloc(ndims,8);
  if (qedims == (double *)0x0) {
    fprintf(_stderr,"%s: %s\n","ddb_h1","memory allocation failed");
    for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
      blk[lVar6] = 0;
    }
  }
  else {
    dVar11 = (double)npes;
    for (lVar6 = 1; lVar6 < ndims; lVar6 = lVar6 + 1) {
      dVar11 = dVar11 / ((double)(long)ardims_00[lVar6] / (double)(long)*ardims_00);
      *qedims = dVar11;
    }
    dVar11 = pow(dVar11,1.0 / (double)ndims);
    *qedims = dVar11;
    for (lVar6 = 1; lVar6 < ndims; lVar6 = lVar6 + 1) {
      qedims[lVar6] = ((double)(long)ardims_00[lVar6] / (double)(long)*ardims_00) * dVar11;
    }
    __nmemb = 1;
    for (lVar6 = 2; lVar6 <= npes; lVar6 = lVar6 + 1) {
      __nmemb = __nmemb + (npes % lVar6 == 0);
    }
    pdivs = (long *)calloc(__nmemb,8);
    if (pdivs == (long *)0x0) {
      fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        blk[lVar6] = 0;
      }
      free(ardims_00);
      ardims_00 = qedims;
    }
    else {
      lVar7 = 0;
      lVar6 = 0;
      if (0 < npes) {
        lVar6 = npes;
      }
      for (lVar10 = 1; lVar10 - lVar6 != 1; lVar10 = lVar10 + 1) {
        if (npes % lVar10 == 0) {
          pdivs[lVar7] = lVar10;
          lVar7 = lVar7 + 1;
        }
      }
      ddb_ap(ndims,qedims,(Integer *)ardims_00,pedims,npes,__nmemb,pdivs);
      free(qedims);
      free(pdivs);
      pedims_00 = (Integer *)calloc(ndims,8);
      if (pedims_00 != (Integer *)0x0) {
        dVar11 = dd_ev(ndims,(Integer *)ardims_00,pedims);
        for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
          pedims_00[lVar6] = pedims[lVar6];
        }
        dVar1 = *ardims_00;
        do {
          for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
            pedims[lVar6] = pedims_00[lVar6];
          }
          lVar6 = *pedims;
          lVar7 = lVar6;
          if (lVar6 <= (long)dVar1) {
            lVar7 = (long)dVar1 % lVar6;
          }
          dVar12 = (double)lVar7 / (double)lVar6;
          lVar7 = 0;
          for (lVar6 = 1; lVar6 < ndims; lVar6 = lVar6 + 1) {
            lVar10 = pedims[lVar6];
            lVar8 = lVar10;
            if (lVar10 <= (long)ardims_00[lVar6]) {
              lVar8 = (long)ardims_00[lVar6] % lVar10;
            }
            dVar13 = (double)lVar8 / (double)lVar10;
            lVar5 = lVar6;
            if ((double)lVar8 / (double)lVar10 <= dVar12) {
              dVar13 = dVar12;
              lVar5 = lVar7;
            }
            lVar7 = lVar5;
            dVar12 = dVar13;
          }
          lVar6 = lVar7;
          dVar12 = dVar11;
          for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
            dVar13 = dVar12;
            if (lVar7 != lVar10) {
              IVar2 = pedims_00[lVar7];
              pedims_00[lVar7] = pedims_00[lVar10];
              pedims_00[lVar10] = IVar2;
              dVar13 = dd_ev(ndims,(Integer *)ardims_00,pedims_00);
              lVar8 = lVar10;
              if (dVar13 <= dVar12) {
                dVar13 = dVar12;
                lVar8 = lVar6;
              }
              lVar6 = lVar8;
              IVar3 = pedims_00[lVar7];
              pedims_00[lVar7] = IVar2;
              pedims_00[lVar10] = IVar3;
            }
            dVar12 = dVar13;
          }
          if (lVar6 != lVar7) {
            IVar2 = pedims_00[lVar7];
            pedims_00[lVar7] = pedims_00[lVar6];
            pedims_00[lVar6] = IVar2;
          }
          bVar4 = dVar11 < dVar12;
          dVar11 = dVar12;
        } while (bVar4);
        for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
          pedims[lVar6] = pedims_00[lVar6];
        }
        free(pedims_00);
        if (dVar12 < threshold) {
          ddb_ex(ndims,(Integer *)ardims_00,npes,threshold,blk,pedims);
        }
        free(ardims_00);
        goto LAB_0018f9e9;
      }
      fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        blk[lVar6] = 0;
      }
    }
  }
  free(ardims_00);
  return;
}

Assistant:

void ddb_h1(long ndims, Integer ardims[], long npes, double threshold,
           Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      double * qedims;
      long * pdivs;
      Integer * apdims;
	  Integer *tard;
      long npdivs;
      double t, q;
      double cb, ub, blb;
      if(ndims==1) {
         pedims[0] = npes;
         blb = dd_ev(ndims,ardims,pedims);
         dd_su(ndims,ardims,pedims,blk);
         return;
      }

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];}

      /*- First solve the load balancing problem exactly in
       *- floating point arithmetic -*/
      qedims = (double *) calloc((size_t)ndims,sizeof(double));
      if(qedims==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      qedims[0] = (double) npes;
      for(i=1;i<ndims;i++) qedims[0] /= (tard[i]/(double)tard[0]);
      qedims[0] = pow(qedims[0],1.0/ndims);

      for(i=1;i<ndims;i++){
          qedims[i] = (tard[i]/(double)tard[0])*qedims[0];
      };

      /*- Set up the search for a integer approximation the floating point solution -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(qedims);
         return;
      }
      /*- Compute the discrete approximation -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;
      ddb_ap(ndims,qedims,tard,pedims,npes,npdivs,pdivs) ; 
      free(qedims);
      free(pdivs);


      /*- Lookout for a permutation of the solution vector
       *- that would improve the initial solution -*/
      apdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(apdims==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      ub = dd_ev(ndims,tard,pedims);
      for(k=0;k<ndims;k++) apdims[k] = pedims[k];

      do {
         for(k=0;k<ndims;k++) pedims[k] = apdims[k];
         blb = ub;

         /*- Find the worst distributed dimension -*/
         h = 0;
         q = (tard[0]<pedims[0]) ? pedims[0] : tard[0]%pedims[0];
         q /= (double)pedims[0];
         for(k=1;k<ndims;k++){
            t = (tard[k]<pedims[k]) ? pedims[k] : tard[k]%pedims[k];
            t /= (double) pedims[k];
            if(t>q) {
              h = k; q = t;
            }
         }

         /*- Swap elements of apdims to improve load balance */
         j = h;
         for(k=0;k<ndims;k++){
            if(k==h) continue;
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
            cb = dd_ev(ndims,tard,apdims);
            if(cb>ub) {
              j = k;
              ub = cb;
            }
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
         }
         if(j!=h){
            i = apdims[h]; apdims[h] = apdims[j]; apdims[j] = i;
         }
      } while (ub > blb);

      for(i=0;i<ndims;i++) pedims[i] = apdims[i];
      blb = ub;
      free(apdims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(blb<threshold) ddb_ex(ndims,tard,npes,threshold,blk,pedims);

      free(tard);

      dd_su(ndims,ardims,pedims,blk);

      return;
      }